

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryOperatorOverloadTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakOverridesToBeUsedInProductionCode_NoSideEffectsFromTurningOffNewMacros_Test::testBody
          (TEST_MemoryLeakOverridesToBeUsedInProductionCode_NoSideEffectsFromTurningOffNewMacros_Test
           *this)

{
  NewDummyClass local_11;
  TEST_MemoryLeakOverridesToBeUsedInProductionCode_NoSideEffectsFromTurningOffNewMacros_Test
  *pTStack_10;
  NewDummyClass dummy;
  TEST_MemoryLeakOverridesToBeUsedInProductionCode_NoSideEffectsFromTurningOffNewMacros_Test
  *this_local;
  
  pTStack_10 = this;
  NewDummyClass::dummyFunction(&local_11);
  return;
}

Assistant:

TEST(MemoryLeakOverridesToBeUsedInProductionCode, NoSideEffectsFromTurningOffNewMacros)
{
    /*
     * Interesting effect of wrapping the operator new around the macro is
     * that the actual new that is called is a different one than expected.
     *
     * The overloaded operator new doesn't actually ever get called.
     *
     * This might come as a surprise, so it is important to realize!
     */
    NewDummyClass dummy;
    dummy.dummyFunction();
    // CHECK(dummy.overloaded_new_called);
}